

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void __thiscall
bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
          (pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *this,size_type n)

{
  pointer puVar1;
  uint *__dest;
  
  if ((this->ebo_).cap < n) {
    __dest = __gnu_cxx::new_allocator<unsigned_int>::allocate
                       ((new_allocator<unsigned_int> *)this,(ulong)n,(void *)0x0);
    puVar1 = (this->ebo_).buf;
    if (puVar1 != (pointer)0x0) {
      memcpy(__dest,puVar1,(ulong)(this->ebo_).size << 2);
      puVar1 = (this->ebo_).buf;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
    }
    (this->ebo_).buf = __dest;
    (this->ebo_).cap = n;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}